

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::GetSymmetryStats
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,float *pos_rms,
          float *neg_rms,float *mean)

{
  float fVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  float *in_RCX;
  float *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  float *in_R8;
  double dVar5;
  double val;
  int32_t i_1;
  int32_t i;
  int32_t n_n;
  int32_t n_p;
  double sum;
  double n_sum;
  double p_sum;
  int32_t n_input;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_40;
  undefined8 local_38;
  
  sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  iVar2 = (int)sVar3;
  local_38 = 0.0;
  local_40 = 0.0;
  fVar1 = 0.0;
  local_4c = 0;
  local_50 = 0;
  for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_54);
    fVar1 = *pvVar4 + fVar1;
  }
  *in_R8 = fVar1 / (float)iVar2;
  for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_58);
    dVar5 = (double)(*pvVar4 - *in_R8);
    if (dVar5 <= 0.0) {
      if (dVar5 < 0.0) {
        local_40 = dVar5 * dVar5 + local_40;
        local_50 = local_50 + 1;
      }
    }
    else {
      local_38 = dVar5 * dVar5 + local_38;
      local_4c = local_4c + 1;
    }
  }
  dVar5 = sqrt(local_38 / (double)local_4c);
  *in_RDX = (float)dVar5;
  dVar5 = sqrt(local_40 / (double)local_50);
  *in_RCX = (float)dVar5;
  return;
}

Assistant:

void EpochTracker::GetSymmetryStats(const std::vector<float>& data, float* pos_rms,
                                    float* neg_rms, float* mean) {
  int32_t n_input = data.size();
  double p_sum = 0.0;
  double n_sum = 0.0;
  double sum = 0.0;
  int32_t n_p = 0;
  int32_t n_n = 0;
  for (int32_t i = 0; i < n_input; ++i) {
    sum += data[i];
  }
  *mean = sum / n_input;
  for (int32_t i = 0; i < n_input; ++i) {
    double val = data[i] - *mean;
    if (val > 0.0) {
      p_sum += (val * val);
      n_p++;
    } else {
      if (val < 0.0) {
        n_sum += (val * val);
        n_n++;
      }
    }
  }
  *pos_rms = sqrt(p_sum / n_p);
  *neg_rms = sqrt(n_sum / n_n);
}